

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::sendTimeRequest(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  int iVar1;
  long lVar2;
  pair<bool,_bool> pVar3;
  DependencyInfo *pDVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ActionMessage AStack_d8;
  
  ActionMessage::ActionMessage(&AStack_d8,cmd_time_request);
  AStack_d8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  AStack_d8.actionTime.internalTimeCode = (this->time_next).internalTimeCode;
  AStack_d8.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  if ((this->super_BaseTimeCoordinator).nonGranting == true) {
    AStack_d8.flags = AStack_d8.flags | 0x80;
  }
  uVar5 = 0x400;
  if (((this->info).wait_for_current_time_updates != false) ||
     (uVar5 = 0x100, AStack_d8.actionTime.internalTimeCode < (this->time_requested).internalTimeCode
     )) {
    AStack_d8.flags = AStack_d8.flags | uVar5;
  }
  lVar8 = (this->time_exec).internalTimeCode;
  lVar6 = (this->info).outputDelay.internalTimeCode;
  lVar7 = 0x7fffffffffffffff - lVar6;
  AStack_d8.Te.internalTimeCode = lVar6 + lVar8;
  if (lVar7 <= lVar8) {
    AStack_d8.Te.internalTimeCode = 0x7fffffffffffffff;
  }
  if ((this->globalTime == false) &&
     (((this->info).event_triggered != false ||
      ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
    lVar2 = (this->upstream).Te.internalTimeCode;
    lVar8 = lVar2 + lVar6;
    if (lVar7 <= lVar2) {
      lVar8 = 0x7fffffffffffffff;
    }
    if (AStack_d8.Te.internalTimeCode <= lVar8) {
      lVar8 = AStack_d8.Te.internalTimeCode;
    }
    AStack_d8.Te.internalTimeCode = 0;
    if (0 < lVar8) {
      AStack_d8.Te.internalTimeCode = lVar8;
    }
    if (AStack_d8.Te.internalTimeCode < AStack_d8.actionTime.internalTimeCode) {
      AStack_d8.actionTime.internalTimeCode = AStack_d8.Te.internalTimeCode;
    }
  }
  lVar8 = (this->upstream).Te.internalTimeCode;
  AStack_d8.Tdemin.internalTimeCode = lVar8 + lVar6;
  if (lVar7 <= lVar8) {
    AStack_d8.Tdemin.internalTimeCode = 0x7fffffffffffffff;
  }
  if (AStack_d8.Te.internalTimeCode < AStack_d8.Tdemin.internalTimeCode) {
    AStack_d8.Tdemin.internalTimeCode = AStack_d8.Te.internalTimeCode;
  }
  if ((this->globalTime == false) &&
     (((this->info).event_triggered != false ||
      ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
    lVar8 = (this->upstream).minDe.internalTimeCode;
    lVar6 = lVar6 + lVar8;
    if (lVar7 <= lVar8) {
      lVar6 = 0x7fffffffffffffff;
    }
    if (AStack_d8.Tdemin.internalTimeCode <= lVar6) {
      lVar6 = AStack_d8.Tdemin.internalTimeCode;
    }
    AStack_d8.Tdemin.internalTimeCode = 0;
    if (0 < lVar6) {
      AStack_d8.Tdemin.internalTimeCode = lVar6;
    }
    if (AStack_d8.Tdemin.internalTimeCode < AStack_d8.actionTime.internalTimeCode) {
      AStack_d8.dest_handle.hid = (this->upstream).minFed.gid;
      AStack_d8.actionTime.internalTimeCode = AStack_d8.Tdemin.internalTimeCode;
      goto LAB_0034ea21;
    }
  }
  AStack_d8.dest_handle.hid = (this->upstream).minFed.gid;
  if (AStack_d8.Tdemin.internalTimeCode < AStack_d8.actionTime.internalTimeCode) {
    AStack_d8.Tdemin.internalTimeCode = AStack_d8.actionTime.internalTimeCode;
  }
LAB_0034ea21:
  if (this->iterating != NO_ITERATIONS) {
    setIterationFlags(&AStack_d8,this->iterating);
    AStack_d8.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  }
  if (this->triggered == true) {
    AStack_d8.flags = AStack_d8.flags | 2;
  }
  pVar3 = checkAndSendTimeRequest(this,&AStack_d8,(GlobalFederateId)(this->upstream).minFed.gid);
  if (((ushort)pVar3 & 1) == 0) {
    if (((triggerFed.gid != -2010000000) && (triggerFed.gid != -1700000000)) &&
       (AStack_d8.dest_id.gid = triggerFed.gid,
       pDVar4 = TimeDependencies::getDependencyInfo
                          (&(this->super_BaseTimeCoordinator).dependencies,triggerFed),
       pDVar4->dependent == true)) {
      AStack_d8.source_handle.hid = (pDVar4->super_TimeData).sequenceCounter;
      if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&AStack_d8);
    }
  }
  else if (((((ushort)pVar3 >> 8 & 1) != 0) &&
           (iVar1 = (this->upstream).minFed.gid, iVar1 != -2010000000)) && (iVar1 != -1700000000)) {
    AStack_d8.dest_handle.hid = -2010000000;
    AStack_d8.source_handle.hid = (this->upstream).responseSequenceCounter;
    if ((this->globalTime == false) &&
       (((this->info).event_triggered != false ||
        ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
      lVar6 = (this->upstream).TeAlt.internalTimeCode;
      lVar7 = (this->time_exec).internalTimeCode;
      lVar2 = (this->info).outputDelay.internalTimeCode;
      lVar8 = lVar2 + lVar7;
      if (0x7fffffffffffffff - lVar2 <= lVar7) {
        lVar8 = 0x7fffffffffffffff;
      }
      AStack_d8.Te.internalTimeCode = lVar2 + lVar6;
      if (0x7fffffffffffffff - lVar2 <= lVar6) {
        AStack_d8.Te.internalTimeCode = 0x7fffffffffffffff;
      }
      if (lVar8 <= AStack_d8.Te.internalTimeCode) {
        AStack_d8.Te.internalTimeCode = lVar8;
      }
    }
    AStack_d8.Tdemin.internalTimeCode = (this->upstream).TeAlt.internalTimeCode;
    if (AStack_d8.Te.internalTimeCode < AStack_d8.Tdemin.internalTimeCode) {
      AStack_d8.Tdemin.internalTimeCode = AStack_d8.Te.internalTimeCode;
    }
    AStack_d8.dest_id.gid = iVar1;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
              ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&AStack_d8);
  }
  ActionMessage::~ActionMessage(&AStack_d8);
  return;
}

Assistant:

void TimeCoordinator::sendTimeRequest(GlobalFederateId triggerFed) const
{
    ActionMessage upd(CMD_TIME_REQUEST);
    upd.source_id = mSourceId;
    upd.actionTime = time_next;
    upd.counter = sequenceCounter;
    if (nonGranting) {
        setActionFlag(upd, non_granting_flag);
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(upd, delayed_timing_flag);
    } else if (time_requested > time_next) {
        setActionFlag(upd, interrupted_flag);
    }
    upd.Te = checkAdd(time_exec, info.outputDelay);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Te = std::min(upd.Te, checkAdd(upstream.Te, info.outputDelay));
        if (upd.Te < timeZero) {
            upd.Te = timeZero;
        }
        upd.actionTime = std::min(upd.actionTime, upd.Te);
    }
    upd.Tdemin = std::min(checkAdd(upstream.Te, info.outputDelay), upd.Te);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Tdemin = std::min(upd.Tdemin, checkAdd(upstream.minDe, info.outputDelay));
        if (upd.Tdemin < timeZero) {
            upd.Tdemin = timeZero;
        }
        if (upd.Tdemin < upd.actionTime) {
            upd.actionTime = upd.Tdemin;
        }
    }
    upd.setExtraData(upstream.minFed.baseValue());

    if (upd.Tdemin < upd.actionTime) {
        upd.Tdemin = upd.actionTime;
    }

    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(upd, iterating);
    }
    upd.counter = sequenceCounter;
    if (triggered) {
        setActionFlag(upd, destination_target);
    }
    auto check = checkAndSendTimeRequest(upd, upstream.minFed);
    if (check.first) {
        if (check.second) {
            if (upstream.minFed.isValid()) {
                upd.dest_id = upstream.minFed;
                upd.setExtraData(GlobalFederateId{}.baseValue());
                upd.setExtraDestData(upstream.responseSequenceCounter);
                if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
                    upd.Te = checkAdd(time_exec, info.outputDelay);
                    upd.Te = std::min(upd.Te, checkAdd(upstream.TeAlt, info.outputDelay));
                }
                upd.Tdemin = std::min(upstream.TeAlt, upd.Te);
                sendMessageFunction(upd);
            }
        }
    } else if (triggerFed.isValid()) {
        upd.dest_id = triggerFed;
        const auto* dep = dependencies.getDependencyInfo(triggerFed);
        if (dep->dependent) {
            upd.setExtraDestData(dep->sequenceCounter);
            sendMessageFunction(upd);
        }
    }

    //    printf("%d next=%f, exec=%f, Tdemin=%f\n", mSourceId, static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}